

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O1

void __thiscall StaticContentsSock::StaticContentsSock(StaticContentsSock *this,string *contents)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Sock::Sock(&this->super_Sock,0xffffffff);
  (this->super_Sock)._vptr_Sock = (_func_int **)&PTR__StaticContentsSock_013d5710;
  (this->m_contents)._M_dataplus._M_p = (pointer)&(this->m_contents).field_2;
  pcVar2 = (contents->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_contents,pcVar2,pcVar2 + contents->_M_string_length);
  this->m_consumed = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit StaticContentsSock(const std::string& contents)
        : Sock{INVALID_SOCKET},
          m_contents{contents}
    {
    }